

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase172::run(TestCase172 *this)

{
  long lVar1;
  Promise<kj::StringPtr> PVar2;
  Promise<int> PVar3;
  __pid_t _Var4;
  void *pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PromiseBase PVar6;
  TransformPromiseNodeBase *this_00;
  Promise<kj::StringPtr> promise2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_148;
  Promise<int> promise;
  int line;
  StringPtr local_130;
  DebugComparison<const_char_(&)[4],_kj::StringPtr> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  yield();
  lVar1 = *(long *)((long)promise2.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)promise2.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&promise2,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:177:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578030;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)((long)promise2.super_PromiseBase.node.ptr + 8) = 0;
    PVar6.node.ptr = (OwnPromiseNode)((long)promise2.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&promise2,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:177:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)promise2.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00578030;
    *(long *)((long)promise2.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  _kjCondition.left = (char (*) [4])0x0;
  local_130.content.ptr = (char *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2);
  PVar3 = promise;
  line = 0xb1;
  lVar1 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar1) < 0x28) {
    pvVar5 = operator_new(0x400);
    PVar6.node.ptr = (OwnPromiseNode)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&promise,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:180:46)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_00578088;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
    PVar6.node.ptr = (OwnPromiseNode)((long)promise.super_PromiseBase.node.ptr + -0x28);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)PVar6.node.ptr,(OwnPromiseNode *)&promise,
               kj::_::
               SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:180:46)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar3.super_PromiseBase.node.ptr + -0x28) = &PTR_destroy_00578088;
    *(long *)((long)PVar3.super_PromiseBase.node.ptr + -0x20) = lVar1;
  }
  _kjCondition.left = (char (*) [4])0x0;
  local_130.content.ptr = (char *)0x0;
  promise2.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)PVar6.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  PVar2 = promise2;
  lVar1 = *(long *)((long)promise2.super_PromiseBase.node.ptr + 8);
  if (lVar1 == 0 || (ulong)((long)promise2.super_PromiseBase.node.ptr - lVar1) < 0x30) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&promise2,
               kj::_::
               TransformPromiseNode<kj::StringPtr,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:183:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:184:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d0) = &PTR_destroy_005780e0;
    *(int **)((long)pvVar5 + 0x3f8) = &line;
    *(void **)((long)pvVar5 + 0x3d8) = pvVar5;
  }
  else {
    *(undefined8 *)((long)promise2.super_PromiseBase.node.ptr + 8) = 0;
    this_00 = (TransformPromiseNodeBase *)((long)promise2.super_PromiseBase.node.ptr + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&promise2,
               kj::_::
               TransformPromiseNode<kj::StringPtr,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:183:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:184:7)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)PVar2.super_PromiseBase.node.ptr + -0x30) = &PTR_destroy_005780e0;
    *(int **)((long)PVar2.super_PromiseBase.node.ptr + -8) = &line;
    *(long *)((long)PVar2.super_PromiseBase.node.ptr + -0x28) = lVar1;
  }
  _kjCondition.left = (char (*) [4])0x0;
  local_130.content.ptr = (char *)0x0;
  local_148.ptr = &this_00->super_PromiseNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2,&local_148);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  local_148.ptr = (PromiseNode *)0x3f3548;
  _Var4 = Promise<kj::StringPtr>::wait(&promise2,&waitScope);
  local_130.content.ptr = (char *)CONCAT44(extraout_var,_Var4);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            (&_kjCondition,(DebugExpression<char_const(&)[4]> *)&local_148,&local_130);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    _Var4 = Promise<kj::StringPtr>::wait(&promise2,&waitScope);
    local_130.content.ptr = (char *)CONCAT44(extraout_var_00,_Var4);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],kj::StringPtr>&,char_const(&)[4],kj::StringPtr>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (promise2.wait(waitScope))\", _kjCondition, \"baz\", promise2.wait(waitScope)"
               ,(char (*) [55])"failed: expected (\"baz\") == (promise2.wait(waitScope))",
               &_kjCondition,(char (*) [4])0x3f3548,&local_130);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, PropagateExceptionTypeChange) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  Promise<StringPtr> promise2 = promise.then([](int i) -> StringPtr { return "foo"; });

  promise2 = promise2.then(
      [](StringPtr s) -> StringPtr { return "bar"; },
      [&](Exception&& e) -> StringPtr { EXPECT_EQ(line, e.getLine()); return "baz"; });

  EXPECT_EQ("baz", promise2.wait(waitScope));
}